

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementShellReissner4::ComputeNormal(ChElementShellReissner4 *this)

{
  long in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  ComputeNormal((ChVector<double> *)this,(ChElementShellReissner4 *)(in_RSI + -0x48),in_XMM0_Qa,
                in_XMM1_Qa);
  return;
}

Assistant:

ChVector<> ChElementShellReissner4::ComputeNormal(const double U, const double V) {
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeFunctionsDerivativeX(Nx, U, V);
    ShapeFunctionsDerivativeY(Ny, U, V);

    const ChVector<>& pA = m_nodes[0]->GetPos();
    const ChVector<>& pB = m_nodes[1]->GetPos();
    const ChVector<>& pC = m_nodes[2]->GetPos();
    const ChVector<>& pD = m_nodes[3]->GetPos();

    ChVector<> Gx = Nx(0) * pA + Nx(1) * pB + Nx(2) * pC + Nx(3) * pD;
    ChVector<> Gy = Ny(0) * pA + Ny(1) * pB + Ny(2) * pC + Ny(3) * pD;

    ChVector<> mnorm = Vcross(Gx, Gy);
    return mnorm.GetNormalized();
}